

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

bdecode_node * __thiscall
libtorrent::bdecode_node::dict_find_string
          (bdecode_node *__return_storage_ptr__,bdecode_node *this,string_view key)

{
  vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  *pvVar1;
  bdecode_node ret;
  bdecode_node local_50;
  
  dict_find(&local_50,this,key);
  if (((long)local_50.m_token_idx == -1) ||
     (((ulong)local_50.m_root_tokens[local_50.m_token_idx] & 0xe0000000) != 0x60000000)) {
    __return_storage_ptr__->m_last_index = 0;
    __return_storage_ptr__->m_last_token = 0;
    __return_storage_ptr__->m_size = 0;
    *(undefined4 *)&__return_storage_ptr__->field_0x3c = 0;
    __return_storage_ptr__->m_buffer = (char *)0x0;
    __return_storage_ptr__->m_buffer_size = 0;
    __return_storage_ptr__->m_token_idx = 0;
    *(undefined1 (*) [16])
     &(__return_storage_ptr__->m_tokens).
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    pvVar1 = &(__return_storage_ptr__->m_tokens).
              super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    ;
    (pvVar1->
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar1->
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->m_token_idx = -1;
    __return_storage_ptr__->m_last_index = -1;
    __return_storage_ptr__->m_last_token = -1;
    __return_storage_ptr__->m_size = -1;
  }
  else {
    bdecode_node(__return_storage_ptr__,&local_50);
  }
  std::
  _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode_node::dict_find_string(string_view key) const
	{
		bdecode_node ret = dict_find(key);
		if (ret.type() == bdecode_node::string_t)
			return ret;
		return bdecode_node();
	}